

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

bool ggml_graph_compute_helper
               (ggml_cgraph *graph,int n_threads,ggml_abort_callback abort_callback,
               void *abort_callback_data)

{
  int iVar1;
  pointer pgVar2;
  undefined8 uVar3;
  code *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  ggml_backend_set_n_threads_t ggml_backend_set_n_threads_fn;
  _func_void_ggml_backend_t_ggml_abort_callback_void_ptr *set_abort_callback_fn;
  ggml_backend_reg *reg;
  ggml_backend_ptr backend;
  pointer in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff74;
  
  ggml_backend_init_by_type(0,0);
  std::unique_ptr<ggml_backend,ggml_backend_deleter>::unique_ptr<ggml_backend_deleter,void>
            ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  pgVar2 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                     ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar3 = ggml_backend_get_device(pgVar2);
  uVar3 = ggml_backend_dev_backend_reg(uVar3);
  pcVar4 = (code *)ggml_backend_reg_get_proc_address(uVar3,"ggml_backend_set_abort_callback");
  if (pcVar4 != (code *)0x0) {
    pgVar2 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                       ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    (*pcVar4)(pgVar2,in_RDX,in_RCX);
  }
  pcVar4 = (code *)ggml_backend_reg_get_proc_address(uVar3,"ggml_backend_set_n_threads");
  if (pcVar4 != (code *)0x0) {
    pgVar2 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                       ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    (*pcVar4)(pgVar2,in_ESI);
  }
  pgVar2 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                     ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  iVar1 = ggml_backend_graph_compute(pgVar2,in_RDI);
  uVar5 = CONCAT13(iVar1 == 0,(int3)in_stack_ffffffffffffff70);
  std::unique_ptr<ggml_backend,_ggml_backend_deleter>::~unique_ptr
            ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)CONCAT44(iVar1,uVar5));
  return (bool)((byte)((uint)uVar5 >> 0x18) & 1);
}

Assistant:

static bool ggml_graph_compute_helper(
          struct ggml_cgraph * graph,
                         int   n_threads,
         ggml_abort_callback   abort_callback,
                        void * abort_callback_data) {

    ggml_backend_ptr backend { ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr) };

    auto * reg = ggml_backend_dev_backend_reg(ggml_backend_get_device(backend.get()));

    auto * set_abort_callback_fn = (ggml_backend_set_abort_callback_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_abort_callback");
    if (set_abort_callback_fn) {
        set_abort_callback_fn(backend.get(), abort_callback, abort_callback_data);
    }

    auto ggml_backend_set_n_threads_fn = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
    if (ggml_backend_set_n_threads_fn) {
        ggml_backend_set_n_threads_fn(backend.get(), n_threads);
    }

    return ggml_backend_graph_compute(backend.get(), graph) == GGML_STATUS_SUCCESS;
}